

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool wallet::CWallet::AttachChain
               (shared_ptr<wallet::CWallet> *walletInstance,Chain *chain,bool rescan_required,
               bilingual_str *error,vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  element_type *peVar7;
  size_type sVar8;
  undefined4 extraout_var;
  Chain *pCVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint *puVar10;
  FoundBlock *pFVar11;
  long *plVar12;
  ConstevalStringLiteral str;
  int *piVar13;
  WalletDatabase *pWVar14;
  byte in_DL;
  Chain *in_RSI;
  long in_FS_OFFSET;
  bool bVar15;
  memory_order __b;
  WalletRescanReserver reserver;
  int block_height;
  CBlockLocator locator_1;
  WalletBatch batch_1;
  int rescan_height;
  CBlockLocator locator;
  WalletBatch batch;
  FoundBlock found;
  optional<long> time_first_key;
  optional<int> tip_height;
  optional<int> fork_height;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock60;
  __memory_order_modifier in_stack_fffffffffffffa58;
  memory_order in_stack_fffffffffffffa5c;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  undefined7 in_stack_fffffffffffffa68;
  undefined1 in_stack_fffffffffffffa6f;
  WalletBatch *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  WalletRescanReserver *in_stack_fffffffffffffa80;
  ChainstateRole role;
  char *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  allocator<char> *in_stack_fffffffffffffa98;
  undefined6 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa6;
  undefined1 in_stack_fffffffffffffaa7;
  ConstevalStringLiteral in_stack_fffffffffffffaa8;
  int *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 uVar16;
  undefined1 in_stack_fffffffffffffabc;
  undefined1 uVar17;
  undefined1 in_stack_fffffffffffffabe;
  ConstevalFormatString<2U> wallet_fmt;
  bool local_4b9;
  bool local_461;
  byte local_411;
  undefined1 local_3f8 [72];
  int local_3b0;
  uint local_3ac;
  __int_type_conflict3 local_3a8;
  undefined1 local_3a0 [44];
  uint local_374;
  undefined1 local_370 [16];
  undefined1 local_360 [15];
  allocator<char> local_351 [48];
  allocator<char> local_321 [15];
  WalletRescanReserver *in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  uint256 *in_stack_fffffffffffffd00;
  CWallet *in_stack_fffffffffffffd08;
  uint256 *local_2c8;
  int *piStack_2c0;
  int64_t *local_2b8;
  int64_t *piStack_2b0;
  int64_t *local_2a8;
  bool *pbStack_2a0;
  CBlockLocator *local_298;
  FoundBlock *pFStack_290;
  CBlock *local_288;
  ulong uStack_280;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined1 local_1f4 [32];
  int local_1d4;
  undefined1 local_168 [160];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  _Optional_payload_base<int> in_stack_ffffffffffffff88;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffa98,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),in_stack_fffffffffffffa88
             ,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c,
             SUB41((uint)in_stack_fffffffffffffa78 >> 0x18,0));
  peVar7 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  bVar15 = true;
  if (peVar7->m_chain != (Chain *)0x0) {
    peVar7 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    bVar15 = peVar7->m_chain == in_RSI;
  }
  if (!bVar15) {
    __assert_fail("!walletInstance->m_chain || walletInstance->m_chain == &chain",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                  ,0xca8,
                  "static bool wallet::CWallet::AttachChain(const std::shared_ptr<CWallet> &, interfaces::Chain &, const bool, bilingual_str &, std::vector<bilingual_str> &)"
                 );
  }
  peVar7 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  peVar7->m_chain = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffaa8.lit,
             (char *)CONCAT17(in_stack_fffffffffffffaa7,
                              CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)),
             in_stack_fffffffffffffa98);
  bVar15 = ArgsManager::GetBoolArg
                     ((ArgsManager *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                      (string *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                      (bool)in_stack_fffffffffffffa6f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  std::allocator<char>::~allocator(local_321);
  if (((bVar15 ^ 0xffU) & 1) != 0) {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    GetDatabase((CWallet *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
    WalletBatch::WalletBatch
              ((WalletBatch *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
               (WalletDatabase *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               SUB41(in_stack_fffffffffffffa5c >> 0x18,0));
    CBlockLocator::CBlockLocator
              ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    bVar15 = WalletBatch::ReadBestBlock
                       (in_stack_fffffffffffffa70,
                        (CBlockLocator *)
                        CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
    local_4b9 = false;
    if (bVar15) {
      sVar8 = std::vector<uint256,_std::allocator<uint256>_>::size
                        ((vector<uint256,_std::allocator<uint256>_> *)
                         CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      local_4b9 = false;
      if (sVar8 != 0) {
        iVar5 = (*in_RSI->_vptr_Chain[2])();
        local_250 = CONCAT44(extraout_var,iVar5);
        local_4b9 = std::optional::operator_cast_to_bool
                              ((optional<int> *)
                               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      }
    }
    if (local_4b9 == false) {
LAB_017100d8:
      bVar15 = false;
    }
    else {
      (*in_RSI->_vptr_Chain[3])(local_48,in_RSI,0);
      std::vector<uint256,_std::allocator<uint256>_>::back
                ((vector<uint256,_std::allocator<uint256>_> *)
                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      bVar15 = ::operator!=((base_blob<256U> *)
                            CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
                            (base_blob<256U> *)
                            CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      if (!bVar15) goto LAB_017100d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaa8.lit,
                 (char *)CONCAT17(in_stack_fffffffffffffaa7,
                                  CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)),
                 in_stack_fffffffffffffa98);
      Untranslated((string *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      bilingual_str::operator=
                ((bilingual_str *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
                 (bilingual_str *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      std::allocator<char>::~allocator(local_351);
      local_411 = 0;
      bVar15 = true;
    }
    CBlockLocator::~CBlockLocator
              ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    WalletBatch::~WalletBatch
              ((WalletBatch *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    if (bVar15) goto LAB_01710c2e;
  }
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),false);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  pCVar9 = CWallet::chain((CWallet *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
  std::shared_ptr<interfaces::Chain::Notifications>::shared_ptr<wallet::CWallet,void>
            ((shared_ptr<interfaces::Chain::Notifications> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
             (shared_ptr<wallet::CWallet> *)0x1710189);
  (*pCVar9->_vptr_Chain[0x29])(local_360,pCVar9,local_370);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  std::unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>::operator=
            ((unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *)
             CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
             (unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *)
             CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  std::unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>::~unique_ptr
            ((unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *)
             CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
  std::shared_ptr<interfaces::Chain::Notifications>::~shared_ptr
            ((shared_ptr<interfaces::Chain::Notifications> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  local_374 = 0;
  if ((in_DL & 1) == 0) {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    GetDatabase((CWallet *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
    WalletBatch::WalletBatch
              ((WalletBatch *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
               (WalletDatabase *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               SUB41(in_stack_fffffffffffffa5c >> 0x18,0));
    CBlockLocator::CBlockLocator
              ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    bVar15 = WalletBatch::ReadBestBlock
                       (in_stack_fffffffffffffa70,
                        (CBlockLocator *)
                        CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
    if (bVar15) {
      iVar5 = (*in_RSI->_vptr_Chain[7])(in_RSI,local_3a0);
      local_258 = CONCAT44(extraout_var_00,iVar5);
      bVar15 = std::optional::operator_cast_to_bool
                         ((optional<int> *)
                          CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      if (bVar15) {
        puVar10 = (uint *)std::optional<int>::operator*
                                    ((optional<int> *)
                                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        local_374 = *puVar10;
      }
    }
    CBlockLocator::~CBlockLocator
              ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    WalletBatch::~WalletBatch
              ((WalletBatch *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  }
  iVar5 = (*in_RSI->_vptr_Chain[2])();
  local_260 = CONCAT44(extraout_var_01,iVar5);
  bVar15 = std::optional::operator_cast_to_bool
                     ((optional<int> *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                     );
  if (bVar15) {
    puVar10 = (uint *)std::optional<int>::operator*
                                ((optional<int> *)
                                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    (*in_RSI->_vptr_Chain[3])(&local_c8,in_RSI,(ulong)*puVar10);
    peVar7 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    *(undefined8 *)(peVar7->m_last_block_processed).super_base_blob<256U>.m_data._M_elems = local_c8
    ;
    *(undefined8 *)((peVar7->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8) =
         local_c0;
    *(undefined8 *)((peVar7->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_b8;
    *(undefined8 *)((peVar7->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_b0;
    piVar13 = std::optional<int>::operator*
                        ((optional<int> *)
                         CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    iVar5 = *piVar13;
    peVar7 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    peVar7->m_last_block_processed_height = iVar5;
  }
  else {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    base_blob<256U>::SetNull
              ((base_blob<256U> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    peVar7 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    peVar7->m_last_block_processed_height = -1;
  }
  bVar15 = std::optional::operator_cast_to_bool
                     ((optional<int> *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                     );
  if ((bVar15) &&
     (puVar10 = (uint *)std::optional<int>::operator*
                                  ((optional<int> *)
                                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)),
     *puVar10 != local_374)) {
    peVar7 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    wallet_fmt.fmt = (char *)&peVar7->m_birth_time;
    std::operator&(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58);
    local_3a8 = (((atomic<long> *)wallet_fmt.fmt)->super___atomic_base<long>)._M_i;
    std::optional<long>::optional<long,_true>
              ((optional<long> *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
               (long *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    bVar15 = std::optional::operator_cast_to_bool
                       ((optional<long> *)
                        CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    if (bVar15) {
      in_stack_fffffffffffffd08 = (CWallet *)0x0;
      in_stack_fffffffffffffcf8 = 0;
      in_stack_fffffffffffffd00 = (uint256 *)0x0;
      stack0xfffffffffffffce8 = 0;
      in_stack_fffffffffffffcf0 = (WalletRescanReserver *)0x0;
      interfaces::FoundBlock::FoundBlock
                ((FoundBlock *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      pFVar11 = interfaces::FoundBlock::height
                          ((FoundBlock *)
                           CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
                           (int *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      local_288 = pFVar11->m_data;
      uStack_280 = *(ulong *)&pFVar11->found;
      local_2c8 = pFVar11->m_hash;
      piStack_2c0 = pFVar11->m_height;
      local_2b8 = pFVar11->m_time;
      piStack_2b0 = pFVar11->m_max_time;
      local_2a8 = pFVar11->m_mtp_time;
      pbStack_2a0 = pFVar11->m_in_active_chain;
      local_298 = pFVar11->m_locator;
      pFStack_290 = pFVar11->m_next_block;
      plVar12 = std::optional<long>::operator*
                          ((optional<long> *)
                           CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      (*in_RSI->_vptr_Chain[0xb])(in_RSI,*plVar12 + -0x1c20,(ulong)local_374,&local_2c8);
      if ((uStack_280 & 1) == 0) {
        puVar10 = (uint *)std::optional<int>::operator*
                                    ((optional<int> *)
                                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        local_374 = *puVar10;
      }
    }
    uVar6 = (*in_RSI->_vptr_Chain[0x21])();
    uVar3 = (undefined1)uVar6;
    if ((uVar6 & 1) == 0) {
      uVar6 = (*in_RSI->_vptr_Chain[0x35])();
      iVar5 = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
      in_stack_fffffffffffffabe = (undefined1)uVar6;
      if ((uVar6 & 1) != 0) goto LAB_017106eb;
    }
    else {
LAB_017106eb:
      puVar10 = (uint *)std::optional<int>::operator*
                                  ((optional<int> *)
                                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      local_3ac = *puVar10;
      while( true ) {
        uVar17 = false;
        if (0 < (int)local_3ac) {
          uVar6 = (*in_RSI->_vptr_Chain[4])(in_RSI,(ulong)(local_3ac - 1));
          in_stack_fffffffffffffabc = (undefined1)uVar6;
          uVar17 = false;
          if ((uVar6 & 1) != 0) {
            uVar17 = local_374 != local_3ac;
          }
        }
        iVar5 = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        if ((bool)uVar17 == false) break;
        local_3ac = local_3ac - 1;
      }
      if (local_374 != local_3ac) {
        uVar6 = (*in_RSI->_vptr_Chain[0x21])();
        uVar16 = CONCAT13((char)uVar6,(int3)in_stack_fffffffffffffab8);
        local_461 = (uVar6 & 1) != 0;
        if (local_461) {
          ::_(in_stack_fffffffffffffaa8);
        }
        else {
          ::_(in_stack_fffffffffffffaa8);
          tinyformat::format<int>
                    ((bilingual_str *)
                     CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffabe,
                                             CONCAT15(uVar17,CONCAT14(in_stack_fffffffffffffabc,
                                                                      uVar16)))),
                     in_stack_fffffffffffffab0);
        }
        local_461 = !local_461;
        bilingual_str::operator=
                  ((bilingual_str *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
                   (bilingual_str *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
        bilingual_str::~bilingual_str
                  ((bilingual_str *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        if (local_461) {
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58))
          ;
        }
        local_411 = 0;
        goto LAB_01710c2e;
      }
    }
    pCVar9 = in_RSI;
    ::_(in_stack_fffffffffffffaa8);
    (*pCVar9->_vptr_Chain[0x25])(pCVar9,local_168);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    str.lit = (char *)std::
                      __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58))
    ;
    piVar13 = std::optional<int>::operator*
                        ((optional<int> *)
                         CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    local_3b0 = *piVar13 - local_374;
    WalletLogPrintf<int,int>
              ((CWallet *)str.lit,wallet_fmt,
               (int *)CONCAT17(in_stack_fffffffffffffaa7,
                               CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)),
               (int *)in_stack_fffffffffffffa98);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
    WalletRescanReserver::WalletRescanReserver
              ((WalletRescanReserver *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
               ,(CWallet *)0x1710992);
    bVar4 = WalletRescanReserver::reserve
                      (in_stack_fffffffffffffa80,SUB41((uint)in_stack_fffffffffffffa7c >> 0x18,0));
    role = (ChainstateRole)((ulong)in_stack_fffffffffffffa80 >> 0x20);
    bVar15 = true;
    if (bVar4) {
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      (*in_RSI->_vptr_Chain[3])(local_1f4,in_RSI,(ulong)local_374);
      std::optional<int>::optional
                ((optional<int> *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      uVar2 = stack0xfffffffffffffce8;
      in_stack_fffffffffffffa60 = 1;
      in_stack_fffffffffffffa58 = 1;
      uVar1 = (ulong)stack0xfffffffffffffce8 >> 0x38;
      bVar4 = SUB81(uVar1,0);
      bVar15 = SUB81((ulong)uVar2 >> 0x30,0);
      unique0x100015d0 = uVar2;
      ScanForWalletTransactions
                (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,iVar5,
                 (optional<int>)in_stack_ffffffffffffff88,in_stack_fffffffffffffcf0,bVar4,bVar15);
      bVar15 = local_1d4 != 0;
    }
    if (bVar15) {
      ::_(str);
      bilingual_str::operator=
                ((bilingual_str *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
                 (bilingual_str *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      local_411 = 0;
    }
    WalletRescanReserver::~WalletRescanReserver
              ((WalletRescanReserver *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
              );
    if (bVar15) goto LAB_01710c2e;
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),false);
    peVar7 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    (*in_RSI->_vptr_Chain[5])(local_3f8);
    chainStateFlushed(peVar7,role,
                      (CBlockLocator *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78)
                     );
    CBlockLocator::~CBlockLocator
              ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    pWVar14 = GetDatabase((CWallet *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
    (*pWVar14->_vptr_WalletDatabase[10])();
  }
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),false);
  local_411 = 1;
LAB_01710c2e:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_411 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::AttachChain(const std::shared_ptr<CWallet>& walletInstance, interfaces::Chain& chain, const bool rescan_required, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    LOCK(walletInstance->cs_wallet);
    // allow setting the chain if it hasn't been set already but prevent changing it
    assert(!walletInstance->m_chain || walletInstance->m_chain == &chain);
    walletInstance->m_chain = &chain;

    // Unless allowed, ensure wallet files are not reused across chains:
    if (!gArgs.GetBoolArg("-walletcrosschain", DEFAULT_WALLETCROSSCHAIN)) {
        WalletBatch batch(walletInstance->GetDatabase());
        CBlockLocator locator;
        if (batch.ReadBestBlock(locator) && locator.vHave.size() > 0 && chain.getHeight()) {
            // Wallet is assumed to be from another chain, if genesis block in the active
            // chain differs from the genesis block known to the wallet.
            if (chain.getBlockHash(0) != locator.vHave.back()) {
                error = Untranslated("Wallet files should not be reused across chains. Restart bitcoind with -walletcrosschain to override.");
                return false;
            }
        }
    }

    // Register wallet with validationinterface. It's done before rescan to avoid
    // missing block connections between end of rescan and validation subscribing.
    // Because of wallet lock being hold, block connection notifications are going to
    // be pending on the validation-side until lock release. It's likely to have
    // block processing duplicata (if rescan block range overlaps with notification one)
    // but we guarantee at least than wallet state is correct after notifications delivery.
    // However, chainStateFlushed notifications are ignored until the rescan is finished
    // so that in case of a shutdown event, the rescan will be repeated at the next start.
    // This is temporary until rescan and notifications delivery are unified under same
    // interface.
    walletInstance->m_attaching_chain = true; //ignores chainStateFlushed notifications
    walletInstance->m_chain_notifications_handler = walletInstance->chain().handleNotifications(walletInstance);

    // If rescan_required = true, rescan_height remains equal to 0
    int rescan_height = 0;
    if (!rescan_required)
    {
        WalletBatch batch(walletInstance->GetDatabase());
        CBlockLocator locator;
        if (batch.ReadBestBlock(locator)) {
            if (const std::optional<int> fork_height = chain.findLocatorFork(locator)) {
                rescan_height = *fork_height;
            }
        }
    }

    const std::optional<int> tip_height = chain.getHeight();
    if (tip_height) {
        walletInstance->m_last_block_processed = chain.getBlockHash(*tip_height);
        walletInstance->m_last_block_processed_height = *tip_height;
    } else {
        walletInstance->m_last_block_processed.SetNull();
        walletInstance->m_last_block_processed_height = -1;
    }

    if (tip_height && *tip_height != rescan_height)
    {
        // No need to read and scan block if block was created before
        // our wallet birthday (as adjusted for block time variability)
        std::optional<int64_t> time_first_key = walletInstance->m_birth_time.load();
        if (time_first_key) {
            FoundBlock found = FoundBlock().height(rescan_height);
            chain.findFirstBlockWithTimeAndHeight(*time_first_key - TIMESTAMP_WINDOW, rescan_height, found);
            if (!found.found) {
                // We were unable to find a block that had a time more recent than our earliest timestamp
                // or a height higher than the wallet was synced to, indicating that the wallet is newer than the
                // current chain tip. Skip rescanning in this case.
                rescan_height = *tip_height;
            }
        }

        // Technically we could execute the code below in any case, but performing the
        // `while` loop below can make startup very slow, so only check blocks on disk
        // if necessary.
        if (chain.havePruned() || chain.hasAssumedValidChain()) {
            int block_height = *tip_height;
            while (block_height > 0 && chain.haveBlockOnDisk(block_height - 1) && rescan_height != block_height) {
                --block_height;
            }

            if (rescan_height != block_height) {
                // We can't rescan beyond blocks we don't have data for, stop and throw an error.
                // This might happen if a user uses an old wallet within a pruned node
                // or if they ran -disablewallet for a longer time, then decided to re-enable
                // Exit early and print an error.
                // It also may happen if an assumed-valid chain is in use and therefore not
                // all block data is available.
                // If a block is pruned after this check, we will load the wallet,
                // but fail the rescan with a generic error.

                error = chain.havePruned() ?
                     _("Prune: last wallet synchronisation goes beyond pruned data. You need to -reindex (download the whole blockchain again in case of pruned node)") :
                     strprintf(_(
                        "Error loading wallet. Wallet requires blocks to be downloaded, "
                        "and software does not currently support loading wallets while "
                        "blocks are being downloaded out of order when using assumeutxo "
                        "snapshots. Wallet should be able to load successfully after "
                        "node sync reaches height %s"), block_height);
                return false;
            }
        }

        chain.initMessage(_("Rescanning…").translated);
        walletInstance->WalletLogPrintf("Rescanning last %i blocks (from block %i)...\n", *tip_height - rescan_height, rescan_height);

        {
            WalletRescanReserver reserver(*walletInstance);
            if (!reserver.reserve() || (ScanResult::SUCCESS != walletInstance->ScanForWalletTransactions(chain.getBlockHash(rescan_height), rescan_height, /*max_height=*/{}, reserver, /*fUpdate=*/true, /*save_progress=*/true).status)) {
                error = _("Failed to rescan the wallet during initialization");
                return false;
            }
        }
        walletInstance->m_attaching_chain = false;
        walletInstance->chainStateFlushed(ChainstateRole::NORMAL, chain.getTipLocator());
        walletInstance->GetDatabase().IncrementUpdateCounter();
    }
    walletInstance->m_attaching_chain = false;

    return true;
}